

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack22_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x3fffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x16;
  *puVar1 = (in[1] & 0xfff) << 10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0xc;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 3) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *puVar2 >> 2 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[3] & 0x3fff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[3] >> 0xe;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0xf) << 0x12 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 4 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[5] & 0xffff) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[5] >> 0x10;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0x3f) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 6 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[7] & 0x3ffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[7] >> 0x12;
  puVar2 = in + 8;
  *puVar1 = (*puVar2 & 0xff) << 0xe | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 8 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[9] & 0xfffff) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[9] >> 0x14;
  *puVar1 = (in[10] & 0x3ff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[10] >> 10;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0xb] & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0xb] >> 0x16;
  *puVar1 = (in[0xc] & 0xfff) << 10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xc] >> 0xc;
  puVar2 = in + 0xd;
  *puVar1 = (*puVar2 & 3) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = *puVar2 >> 2 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[0xe] & 0x3fff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0xe] >> 0xe;
  puVar2 = in + 0xf;
  *puVar1 = (*puVar2 & 0xf) << 0x12 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = *puVar2 >> 4 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = *puVar2 >> 0x1a;
  *puVar1 = (in[0x10] & 0xffff) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x10] >> 0x10;
  puVar2 = in + 0x11;
  *puVar1 = (*puVar2 & 0x3f) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = *puVar2 >> 6 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0x12] & 0x3ffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x12] >> 0x12;
  puVar2 = in + 0x13;
  *puVar1 = (*puVar2 & 0xff) << 0xe | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = *puVar2 >> 8 & 0x3fffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[0x14] & 0xfffff) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x14] >> 0x14;
  *puVar1 = (in[0x15] & 0x3ff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1f;
  *puVar1 = in[0x15] >> 10;
  *puVar1 = base + *puVar1;
  return in + 0x16;
}

Assistant:

uint32_t * unpack22_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 22 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 22 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 22 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 22 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 22 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 22 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 22 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 22 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 22 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 22 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 22 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 22 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 22 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 22 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 22 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 22 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 22 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 22 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 22 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 22 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}